

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall lexer::Lexer::Lexer(Lexer *this,LexerRules *lexerRules)

{
  _Rb_tree_node_base *p_Var1;
  char *pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  _Rb_tree_node_base *p_Var4;
  reference this_00;
  _Base_ptr p_Var5;
  char *pcVar6;
  vector<lexer::Transition,_std::allocator<lexer::Transition>_> lexerState;
  char local_61;
  _Base_ptr local_60;
  _Rb_tree_node_base *local_58;
  _Rb_tree_node_base *local_50;
  _Vector_base<lexer::Transition,_std::allocator<lexer::Transition>_> local_48;
  
  (this->lexerStateMachine).
  super__Vector_base<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lexerStateMachine).
  super__Vector_base<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lexerStateMachine).
  super__Vector_base<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
  ::resize(&this->lexerStateMachine,(lexerRules->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
  local_60 = &(lexerRules->_M_t)._M_impl.super__Rb_tree_header._M_header;
  p_Var5 = (lexerRules->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var5 != local_60) {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>::resize
              ((vector<lexer::Transition,_std::allocator<lexer::Transition>_> *)&local_48,0xff);
    local_50 = (_Rb_tree_node_base *)&p_Var5[1]._M_left;
    local_58 = p_Var5;
    for (p_Var4 = *(_Rb_tree_node_base **)(p_Var5 + 2); p_Var1 = local_58, p_Var4 != local_50;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      if ((char)p_Var4[2]._M_color == _S_black) {
        pcVar2 = *(char **)(p_Var4 + 1);
        for (pcVar6 = pcVar2; pcVar6 != pcVar2 + (long)p_Var4[1]._M_parent; pcVar6 = pcVar6 + 1) {
          updateTransition(this,(vector<lexer::Transition,_std::allocator<lexer::Transition>_> *)
                                &local_48,(Transition *)&p_Var4[2]._M_parent,*pcVar6);
          pcVar2 = *(char **)(p_Var4 + 1);
        }
      }
      else {
        for (local_61 = '\0'; -1 < local_61; local_61 = local_61 + '\x01') {
          _Var3 = std::
                  __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            (*(long *)(p_Var4 + 1),
                             (long)&(p_Var4[1]._M_parent)->_M_color + *(long *)(p_Var4 + 1),
                             &local_61);
          if (_Var3._M_current ==
              (char *)((long)&(p_Var4[1]._M_parent)->_M_color + *(long *)(p_Var4 + 1))) {
            updateTransition(this,(vector<lexer::Transition,_std::allocator<lexer::Transition>_> *)
                                  &local_48,(Transition *)&p_Var4[2]._M_parent,local_61);
          }
        }
      }
    }
    this_00 = std::
              vector<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
              ::at(&this->lexerStateMachine,(long)(int)local_58[1]._M_color);
    std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>::operator=
              (this_00,(vector<lexer::Transition,_std::allocator<lexer::Transition>_> *)&local_48);
    std::_Vector_base<lexer::Transition,_std::allocator<lexer::Transition>_>::~_Vector_base
              (&local_48);
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
  }
  return;
}

Assistant:

explicit Lexer(LexerRules const &lexerRules) {
            lexerStateMachine.resize(lexerRules.size());

            size_t maxChar = std::numeric_limits<uint8_t>::max();

            for_each_c (LexerRules, lexerRules, rule) {
                std::vector<Transition> lexerState;

                lexerState.resize(static_cast<size_t>(maxChar));

                for_each_c (LexerRule, rule->second, transition) {
                    if (transition->first.inSet)
                        for_each_c (std::string, transition->first.chars, c)
                            updateTransition(lexerState, transition->second, *c);
                    else
                        for (char c = 0; c < maxChar; ++c)
                            if (std::find(transition->first.chars.begin(),
                                          transition->first.chars.end(), c) == transition->first.chars.end())
                                updateTransition(lexerState, transition->second, c);
                }

                lexerStateMachine.at(static_cast<size_t>(rule->first)) = lexerState;
            }
        }